

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
::init_internal(btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                *this,field_type position,
               btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
               *parent)

{
  field_type i;
  
  init_leaf(this,position,'\n',parent);
  if (((ulong)this & 7) == 0) {
    this[0xb] = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                 )0x0;
    i = start(this);
    mutable_child(this,i);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *, std::less<google::protobuf::internal::VariantKey>, google::protobuf::internal::MapAllocator<std::pair<const google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>, absl::container_internal::btree_node<absl::container_internal::map_params<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *, std::less<google::protobuf::internal::VariantKey>, google::protobuf::internal::MapAllocator<std::pair<const google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *, std::less<google::protobuf::internal::VariantKey>, google::protobuf::internal::MapAllocator<std::pair<const google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *>, absl::container_internal::btree_node<absl::container_internal::map_params<google::protobuf::internal::VariantKey, google::protobuf::internal::NodeBase *, std::less<google::protobuf::internal::VariantKey>, google::protobuf::internal::MapAllocator<std::pair<const google::protobuf::internal::VariantKey, google::protobuf::inte..." /* TRUNCATED STRING LITERAL */
               );
}

Assistant:

void init_internal(field_type position, btree_node *parent) {
    init_leaf(position, kNodeSlots, parent);
    // Set `max_count` to a sentinel value to indicate that this node is
    // internal.
    set_max_count(kInternalNodeMaxCount);
    absl::container_internal::SanitizerPoisonMemoryRegion(
        &mutable_child(start()), (kNodeSlots + 1) * sizeof(btree_node *));
  }